

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O3

void __thiscall
agge::tests::LayoutTests::MultiLineUnboundLayoutProducesGlyphRunsForEachLineUTF8(LayoutTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar6;
  long lVar7;
  undefined8 *puVar8;
  richtext_t *prVar9;
  string *psVar10;
  undefined8 *puVar11;
  byte bVar12;
  factory_ptr f2;
  factory_ptr f1;
  positioned_glyph reference21 [5];
  positioned_glyph reference22 [4];
  positioned_glyph reference23 [7];
  positioned_glyph reference12 [7];
  layout l2;
  layout l1;
  positioned_glyph reference11 [10];
  char_to_index indices [4];
  undefined1 local_580 [16];
  undefined1 local_570 [24];
  vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> local_558 [24];
  bool local_540;
  undefined1 local_538 [16];
  undefined1 local_528 [24];
  pointer ppStack_510;
  pointer ppStack_508;
  undefined4 uStack_500;
  undefined4 local_4fc;
  undefined4 uStack_4f8;
  undefined8 uStack_4f4;
  positioned_glyph local_4ec;
  undefined1 local_4e0 [24];
  pointer local_4c8 [3];
  bool local_4b0;
  undefined1 local_4a8 [24];
  pointer local_490 [3];
  bool local_478;
  undefined1 local_470 [40];
  string local_448;
  undefined8 local_428;
  undefined8 uStack_420;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_418;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_400;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_3e8;
  ref_text_line local_3d0;
  ref_text_line local_3a8;
  ref_text_line local_380;
  undefined1 local_358 [24];
  pointer local_340;
  bool local_328;
  undefined4 local_308;
  undefined1 local_304 [4];
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_300;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_2e8;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_2d0;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_2b8;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_2a0;
  string local_288;
  string local_268 [2];
  undefined4 local_218;
  positioned_glyph local_214;
  layout local_208;
  layout local_1b8;
  richtext_t local_168;
  undefined1 local_f0 [8];
  glyph local_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar12 = 0;
  local_e8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000042;
  local_e8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3000000e0;
  local_e8.metrics.dx = 1.58101006669199e-322;
  local_e8.metrics.dy = 2.12200073310393e-314;
  local_e8.outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x401c666666666666;
  local_c0 = 0;
  uStack_b8 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0x4026000000000000;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x402a000000000000;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0x4031000000000000;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_538,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,(glyph (*) [4])&local_e8);
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_580,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm2,(glyph (*) [4])&local_e8);
  local_1b8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_1b8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_1b8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._glyphs._limit = (positioned_glyph *)0x0;
  local_1b8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8._glyphs._begin = (positioned_glyph *)0x0;
  local_1b8._glyphs._end = (positioned_glyph *)0x0;
  local_1b8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_208._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_208._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208._glyphs._limit = (positioned_glyph *)0x0;
  local_208._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208._glyphs._begin = (positioned_glyph *)0x0;
  local_208._glyphs._end = (positioned_glyph *)0x0;
  paVar1 = &local_268[0].field_2;
  local_268[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,anon_var_dwarf_e5991,anon_var_dwarf_e5991 + 0x1e);
  R(&local_168,local_268);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_1b8,&local_168,local_538._0_8_);
  paVar2 = &local_168._base_annotation.basic.family.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._base_annotation.basic.family._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_168._annotations);
  paVar3 = &local_168._underlying.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._underlying._M_dataplus._M_p != paVar3) {
    operator_delete(local_168._underlying._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_268[0]._M_dataplus._M_p);
  }
  local_268[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,anon_var_dwarf_e59ab,anon_var_dwarf_e59ab + 0x1d);
  R(&local_168,local_268);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_208,&local_168,local_580._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._base_annotation.basic.family._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_168._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._underlying._M_dataplus._M_p != paVar3) {
    operator_delete(local_168._underlying._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_268[0]._M_dataplus._M_p);
  }
  puVar8 = &DAT_001a0710;
  prVar9 = &local_168;
  for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
    (prVar9->_underlying)._M_dataplus._M_p = (pointer)*puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    prVar9 = (richtext_t *)((long)prVar9 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  puVar8 = &DAT_001a0800;
  psVar10 = local_268;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    (psVar10->_M_dataplus)._M_p = (pointer)*puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    psVar10 = (string *)((long)psVar10 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  local_218 = 0;
  local_358._0_8_ = *(undefined8 *)(local_538._0_8_ + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_538._0_8_ + 0x10);
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_358._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_358._8_8_ = p_Var4;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
        goto LAB_001540e3;
      }
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
    p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
  }
LAB_001540e3:
  local_358._16_4_ = 0.0;
  local_358._20_4_ = 0.0;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)&local_340,
             (positioned_glyph *)&local_168,(positioned_glyph *)local_f0,(allocator_type *)local_528
            );
  local_328 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_3a8,1,(value_type *)local_358,(allocator_type *)local_528);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_4a8,0.0,10.0,120.2,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_3a8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_3e8,1,(value_type *)local_4a8,(allocator_type *)local_528);
  local_528._0_8_ = *(undefined8 *)(local_538._0_8_ + 8);
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_538._0_8_ + 0x10);
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_528._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_528._8_8_ = p_Var5;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
        goto LAB_001541d1;
      }
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
  }
LAB_001541d1:
  local_528._16_4_ = 0.0;
  local_528._20_4_ = 0.0;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)&ppStack_510,
             (positioned_glyph *)local_268,&local_214,(allocator_type *)local_570);
  uStack_4f8._0_1_ = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_3d0,1,(value_type *)local_528,(allocator_type *)local_570);
  ref_text_line::ref_text_line
            ((ref_text_line *)local_4e0,0.0,24.0,87.1,
             (vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_3d0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_3e8,(value_type *)local_4e0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_380,&local_3e8);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)local_470,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1b8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1b8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_570);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_448,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_570,&local_448,0x12f);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_380,(vector<agge::text_line,_std::allocator<agge::text_line>_> *)local_470,
             (LocationInfo *)local_570);
  if ((undefined1 *)local_570._0_8_ != local_570 + 0x10) {
    operator_delete((void *)local_570._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  if ((pointer)local_470._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_470._0_8_);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            ((vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> *)
             &local_380);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_4e0 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_3d0);
  if (ppStack_510 != (pointer)0x0) {
    operator_delete(ppStack_510);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_528._8_8_);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_3e8);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             (local_4a8 + 0x10));
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            ((vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> *)
             &local_3a8);
  if (local_340 != (pointer)0x0) {
    operator_delete(local_340);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_358._8_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  uStack_4f8._0_1_ = true;
  uStack_4f8._1_3_ = 0;
  uStack_4f4 = 0x41500000;
  ppStack_508 = (pointer)0x300000000;
  uStack_500 = 0x41880000;
  local_4fc = 0;
  local_528._16_4_ = 17.0;
  local_528._20_4_ = 0.0;
  ppStack_510 = (pointer)0x40e3333300000000;
  local_528._0_8_ = (element_type *)0x4130000000000001;
  local_528._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x300000000;
  local_428 = 0x200000000;
  uStack_420 = 0x41500000;
  local_448.field_2._M_allocated_capacity = 0x40e33333;
  local_448.field_2._8_8_ = 0x4130000000000001;
  local_448._M_dataplus._M_p = (pointer)0x4130000000000001;
  local_448._M_string_length = 0;
  puVar8 = &DAT_001a0800;
  puVar11 = (undefined8 *)local_358;
  for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar11 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
    puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
  }
  local_308 = 0;
  local_4a8._0_8_ = *(vector_r *)(local_580._0_8_ + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_580._0_8_ + 0x10);
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_4a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_4a8._8_8_ = p_Var4;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
        goto LAB_001544b3;
      }
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
    p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
  }
LAB_001544b3:
  local_4a8._16_4_ = 0.0;
  local_4a8._20_4_ = 0.0;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)local_490,
             (positioned_glyph *)local_528,&local_4ec,(allocator_type *)local_4e0);
  local_478 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_2b8,1,(value_type *)local_4a8,(allocator_type *)local_4e0);
  ref_text_line::ref_text_line(&local_380,0.0,14.0,65.1,&local_2b8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_418,1,&local_380,(allocator_type *)local_4e0);
  local_4e0._0_8_ = *(vector_r *)(local_580._0_8_ + 8);
  p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_580._0_8_ + 0x10);
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_4e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_4e0._8_8_ = p_Var5;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
        goto LAB_001545b9;
      }
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
  }
LAB_001545b9:
  local_4e0._16_4_ = 0.0;
  local_4e0._20_4_ = 0.0;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            ((vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> *)local_4c8,
             (positioned_glyph *)&local_448,(positioned_glyph *)&local_418,
             (allocator_type *)local_570);
  local_4b0 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_2d0,1,(value_type *)local_4e0,(allocator_type *)local_570);
  ref_text_line::ref_text_line(&local_3a8,0.0,32.0,42.1,&local_2d0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_418,&local_3a8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_400,&local_418);
  local_570._0_8_ = *(undefined8 *)(local_580._0_8_ + 8);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_580._0_8_ + 0x10);
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_570._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_570._8_8_ = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_001546b5;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_001546b5:
  local_570._16_8_ = 0;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            (local_558,(positioned_glyph *)local_358,(positioned_glyph *)local_304,
             (allocator_type *)local_470);
  local_540 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_2e8,1,(value_type *)local_570,(allocator_type *)local_470);
  ref_text_line::ref_text_line(&local_3d0,0.0,50.0,87.1,&local_2e8);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::push_back
            (&local_400,&local_3d0);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_2a0,&local_400);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_300,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_208._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_208._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)local_470);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_470,&local_288,0x141);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_2a0,&local_300,(LocationInfo *)local_470);
  if ((pointer)local_470._0_8_ != (pointer)(local_470 + 0x10)) {
    operator_delete((void *)local_470._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((vector_r)
      local_300.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (vector_r)0x0) {
    operator_delete(local_300.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_2a0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3d0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2e8);
  if ((void *)local_558._0_8_ != (void *)0x0) {
    operator_delete((void *)local_558._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_570._8_8_);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_400);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3a8._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2d0);
  if (local_4c8[0] != (pointer)0x0) {
    operator_delete(local_4c8[0]);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0._8_8_);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_418);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_380._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_2b8);
  if (local_490[0] != (pointer)0x0) {
    operator_delete(local_490[0]);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a8._8_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (local_208._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_208._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_208._glyph_runs);
  if (local_208._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_208._glyphs._begin);
  }
  if (local_1b8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_1b8._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_1b8._glyph_runs);
  if (local_1b8._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_1b8._glyphs._begin);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_580._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._8_8_);
  }
  lVar7 = 0x88;
  do {
    pvVar6 = *(void **)((long)&local_e8.outline.
                               super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar7);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6);
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x18);
  return;
}

Assistant:

test( MultiLineUnboundLayoutProducesGlyphRunsForEachLineUTF8 )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { 0x2713, 1 }, { L'B', 2 }, { 0xE0, 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;

				l1.process(R("\xE2\x9C\x93""B\xC3\xA0 \xC3\xA0""B\xE2\x9C\x93 \xE2\x9C\x93""B\n\xE2\x9C\x93""BB BB\xC3\xA0\n"), limit::none(), *f1);
				l2.process(R("\xE2\x9C\x93""\xC3\xA0 \xC3\xA0""B\n\xE2\x9C\x93 \xE2\x9C\x93""B\n\xE2\x9C\x93""BB BB\xC3\xA0"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference11[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference12[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, 
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 120.2f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference11))
					+ ref_text_line(0.0f, 24.0f, 87.1f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference12)),
					mkvector(l1.begin(), l1.end()));


				positioned_glyph reference21[] = {
					{ 1, { 11.0f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 3, { 17.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference22[] = {
					{ 1, { 11.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } },
				};
				positioned_glyph reference23[] = {
					{ 1, { 11.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 2, { 13.0f, 0.0f } }, { 0, { 7.1f, 0.0f } }, { 2, { 13.0f, 0.0f } },
						{ 2, { 13.0f, 0.0f } }, { 3, { 17.0f, 0.0f } },
				};

				assert_equal(plural
					+ ref_text_line(0.0f, 14.0f, 65.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference21))
					+ ref_text_line(0.0f, 32.0f, 42.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference22))
					+ ref_text_line(0.0f, 50.0f, 87.1f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference23)),
					mkvector(l2.begin(), l2.end()));
			}